

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

int compare_list(char **name,void **l,zip_uint64_t *n,int size,_func_int_void_ptr_void_ptr *cmp,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_void_ptr *print)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint local_4c;
  int diff;
  int c;
  int j;
  uint i [2];
  _func_int_char_ptr_ptr_void_ptr_void_ptr *check_local;
  _func_int_void_ptr_void_ptr *cmp_local;
  int size_local;
  zip_uint64_t *n_local;
  void **l_local;
  char **name_local;
  
  i = (uint  [2])check;
  j = 0;
  c = 0;
  local_4c = 0;
  while( true ) {
    bVar4 = false;
    if ((ulong)(uint)c < *n) {
      bVar4 = (ulong)(uint)j < n[1];
    }
    if (!bVar4) break;
    iVar1 = (*cmp)(*l,l[1]);
    if (iVar1 == 0) {
      if (i != (uint  [2])0x0) {
        uVar2 = (*(code *)i)(name,*l,l[1]);
        local_4c = uVar2 | local_4c;
      }
      c = c + 1;
      *l = (void *)((long)*l + (long)size);
      j = j + 1;
      l[1] = (void *)((long)l[1] + (long)size);
    }
    else {
      if (iVar1 < 0) {
        if ((header_done == 0) && (verbose != 0)) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
        }
        if (verbose != 0) {
          printf("%c ",0x2d);
          (*print)(*l);
        }
        c = c + 1;
        *l = (void *)((long)*l + (long)size);
      }
      else {
        if ((header_done == 0) && (verbose != 0)) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
        }
        if (verbose != 0) {
          printf("%c ",0x2b);
          (*print)(l[1]);
        }
        j = j + 1;
        l[1] = (void *)((long)l[1] + (long)size);
      }
      local_4c = 1;
    }
  }
  for (diff = 0; diff < 2; diff = diff + 1) {
    while ((ulong)(uint)(&c)[diff] < n[diff]) {
      if ((header_done == 0) && (verbose != 0)) {
        printf("--- %s\n+++ %s\n",*name,name[1]);
        header_done = 1;
      }
      if (verbose != 0) {
        uVar3 = 0x2d;
        if (diff != 0) {
          uVar3 = 0x2b;
        }
        printf("%c ",uVar3);
        (*print)(l[diff]);
      }
      local_4c = 1;
      (&c)[diff] = (&c)[diff] + 1;
      l[diff] = (void *)((long)l[diff] + (long)size);
    }
  }
  return local_4c;
}

Assistant:

static int
compare_list(char *const name[2], const void *l[2], const zip_uint64_t n[2], int size, int (*cmp)(const void *, const void *), int (*check)(char *const name[2], const void *, const void *), void (*print)(const void *)) {
    unsigned int i[2];
    int j, c;
    int diff;

#define INC(k) (i[k]++, l[k] = ((const char *)l[k]) + size)
#define PRINT(k)                                          \
    do {                                                  \
	if (header_done == 0 && verbose) {                \
	    printf("--- %s\n+++ %s\n", name[0], name[1]); \
	    header_done = 1;                              \
	}                                                 \
	if (verbose) {                                    \
	    printf("%c ", (k) ? '+' : '-');               \
	    print(l[k]);                                  \
	}                                                 \
	diff = 1;                                         \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < n[0] && i[1] < n[1]) {
	c = cmp(l[0], l[1]);

	if (c == 0) {
	    if (check)
		diff |= check(name, l[0], l[1]);
	    INC(0);
	    INC(1);
	}
	else if (c < 0) {
	    PRINT(0);
	    INC(0);
	}
	else {
	    PRINT(1);
	    INC(1);
	}
    }

    for (j = 0; j < 2; j++) {
	while (i[j] < n[j]) {
	    PRINT(j);
	    INC(j);
	}
    }

    return diff;
}